

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void saveImage(char *filepath,GLFWwindow *w)

{
  PFNGLREADPIXELSPROC p_Var1;
  GLsizei GVar2;
  GLsizei GVar3;
  GLFWwindow *filename;
  int iVar4;
  size_type __n;
  char *pcVar5;
  int local_60;
  allocator_type local_49;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> buffer;
  GLsizei bufferSize;
  GLsizei stride;
  GLsizei nrChannels;
  int height;
  int width;
  GLFWwindow *w_local;
  char *filepath_local;
  
  _height = w;
  w_local = (GLFWwindow *)filepath;
  glfwGetFramebufferSize(w,&nrChannels,&stride);
  iVar4 = nrChannels * 3;
  if (iVar4 % 4 == 0) {
    local_60 = 0;
  }
  else {
    local_60 = 4 - iVar4 % 4;
  }
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       (iVar4 + local_60) * stride;
  __n = (size_type)(int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_48,__n,&local_49);
  std::allocator<char>::~allocator(&local_49);
  (*glad_glPixelStorei)(0xd05,4);
  (*glad_glReadBuffer)(0x404);
  GVar3 = nrChannels;
  GVar2 = stride;
  p_Var1 = glad_glReadPixels;
  pcVar5 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_48);
  (*p_Var1)(0,0,GVar3,GVar2,0x1907,0x1401,pcVar5);
  stbi_flip_vertically_on_write(1);
  filename = w_local;
  pcVar5 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_48);
  stbi_write_png((char *)filename,nrChannels,stride,3,pcVar5,iVar4 + local_60);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_48)
  ;
  return;
}

Assistant:

void saveImage(const char filepath[], GLFWwindow* w) {
	int width, height;
	glfwGetFramebufferSize(w, &width, &height);
	GLsizei nrChannels = 3;
	GLsizei stride = nrChannels * width;
	stride += (stride % 4) ? (4 - stride % 4) : 0;
	GLsizei bufferSize = stride * height;
	std::vector<char> buffer(bufferSize);
	glPixelStorei(GL_PACK_ALIGNMENT, 4);
	glReadBuffer(GL_FRONT);
	glReadPixels(0, 0, width, height, GL_RGB, GL_UNSIGNED_BYTE, buffer.data());
	stbi_flip_vertically_on_write(true);
	stbi_write_png(filepath, width, height, nrChannels, buffer.data(), stride);
}